

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer_strategy.cpp
# Opt level: O1

void __thiscall
TracerStrategy::generateActions(TracerStrategy *this,PlayerSight *sight,Actions *actions)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  float fVar5;
  bool bVar6;
  Router *this_00;
  int *piVar7;
  int iVar8;
  float fVar9;
  Vec2 pos;
  float fVar10;
  float fVar11;
  Vec2 pos_00;
  
  if ((this->super_Strategy).disabled != false) {
    return;
  }
  piVar7 = *(int **)&sight->unitInSight;
  piVar4 = *(int **)&sight->field_0x80;
  if (piVar7 != piVar4) {
    do {
      iVar2 = *piVar7;
      iVar3 = this->target;
      iVar8 = 0;
      if (iVar2 == iVar3) {
        fVar9 = (float)piVar7[2];
        fVar1 = (float)piVar7[1];
        fVar5 = (float)piVar7[2];
        pos.x = (float)piVar7[1] + (float)piVar7[3];
        fVar10 = (float)piVar7[4];
        pos.y = fVar9 + fVar10;
        this_00 = Router::getInstance();
        bVar6 = Router::Reachable(this_00,pos);
        fVar11 = pos.x;
        fVar10 = fVar9 + fVar10;
        if (!bVar6) {
          fVar11 = fVar1;
          fVar10 = fVar5;
        }
        fVar10 = fVar10 - (sight->pos).y;
        fVar11 = fVar11 - (sight->pos).x;
        fVar9 = fVar11 * fVar11 + fVar10 * fVar10;
        if (fVar9 < 0.0) {
          fVar9 = sqrtf(fVar9);
        }
        else {
          fVar9 = SQRT(fVar9);
        }
        fVar1 = this->distance;
        iVar8 = 2;
        if (fVar1 < fVar9) {
          fVar11 = fVar11 / fVar9;
          fVar10 = fVar10 / fVar9;
          if (fVar9 + -2.0 <= fVar1) {
            fVar11 = fVar11 * (fVar9 - fVar1);
            fVar10 = (fVar9 - fVar1) * fVar10;
          }
          else {
            fVar11 = fVar11 + fVar11;
            fVar10 = fVar10 + fVar10;
          }
          pos_00.x = fVar11 + (sight->pos).x;
          pos_00.y = fVar10 + (sight->pos).y;
          iVar8 = 1;
          Actions::emplace(actions,SelectDestination,sight->id,pos_00);
        }
      }
      if (iVar2 == iVar3) goto LAB_00105581;
      piVar7 = piVar7 + 5;
    } while (piVar7 != piVar4);
    iVar8 = 2;
LAB_00105581:
    if (iVar8 != 2) {
      return;
    }
  }
  Actions::emplace(actions,SelectDestination,sight->id,sight->pos);
  return;
}

Assistant:

void TracerStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    for (auto uinfo : sight.unitInSight)
        if (uinfo.id == target)
        {
            Vec2 goal = uinfo.pos + uinfo.velocity;
            if (!Router::getInstance()->Reachable(goal))
                goal = uinfo.pos;
            Vec2 direction = goal - sight.pos;
            float dist = direction.length();
            if (dist <= distance)
                break;
            Vec2 e0 = direction / dist;
            if (dist - PlayerVelocity <= distance)
                actions->emplace(SelectDestination, sight.id, sight.pos + e0 * (dist - distance));
            else
                actions->emplace(SelectDestination, sight.id, sight.pos + e0 * PlayerVelocity);
            return;
        }
    actions->emplace(SelectDestination, sight.id, sight.pos);
    return;
}